

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlitDepthStencilCase::render(BlitDepthStencilCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  uint uVar1;
  int iVar2;
  int i;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  long lVar6;
  Context *pCVar7;
  deUint32 *pdVar8;
  int i_1;
  int iVar9;
  deUint32 *renderbuffers;
  deUint32 *renderbuffers_00;
  deUint32 *framebuffers;
  bool bVar10;
  deUint32 dstFbo;
  deUint32 srcFbo;
  deUint32 gridTex;
  deUint32 local_528;
  deUint32 local_524;
  deUint32 local_520;
  int local_51c;
  deUint32 dstDepthStencilRbo;
  deUint32 srcDepthStencilRbo;
  deUint32 dstColorRbo;
  deUint32 srcColorRbo;
  TextureLevel data;
  PixelBufferAccess local_4d8;
  Surface *local_4b0;
  deUint32 *local_4a8;
  deUint32 *local_4a0;
  Vec4 local_498;
  Vec4 local_488;
  FlatColorShader flatShader;
  GradientShader gradShader;
  Texture2DShader texShader;
  
  local_4b0 = dst;
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.m_format.order = 0x28;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&flatShader,(iterator)0x0,
             (DataType *)&data);
  lVar6 = 0;
  do {
    data.m_size.m_data[lVar6 + -2] = 0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_4d8.super_ConstPixelBufferAccess.m_format.order = R;
  local_4d8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,(DataTypes *)&flatShader,TYPE_FLOAT_VEC4,(Vec4 *)&data,(Vec4 *)&local_4d8);
  if (flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar3 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&flatShader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar4 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&texShader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar5 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&gradShader);
  srcFbo = 0;
  dstFbo = 0;
  srcColorRbo = 0;
  dstColorRbo = 0;
  srcDepthStencilRbo = 0;
  dstDepthStencilRbo = 0;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  data.m_format.order = R;
  data.m_format.type = SNORM_INT8;
  data.m_size.m_data[0] = 0;
  data.m_size.m_data[1] = 0;
  lVar6 = 0;
  do {
    local_4d8.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2] = 0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar7,dVar5,(Vec4 *)&data,(Vec4 *)&local_4d8);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar7,dVar4);
  iVar9 = 1;
  local_4a0 = &this->m_dstBuffers;
  local_4a8 = &this->m_srcBuffers;
  local_528 = dVar5;
  local_524 = dVar4;
  local_520 = dVar3;
  do {
    bVar10 = iVar9 == 1;
    framebuffers = &dstFbo;
    if (bVar10) {
      framebuffers = &srcFbo;
    }
    renderbuffers_00 = &dstColorRbo;
    if (bVar10) {
      renderbuffers_00 = &srcColorRbo;
    }
    renderbuffers = &dstDepthStencilRbo;
    if (bVar10) {
      renderbuffers = &srcDepthStencilRbo;
    }
    lVar6 = 0xac;
    pdVar8 = local_4a0;
    if (bVar10) {
      lVar6 = 0x90;
      pdVar8 = local_4a8;
    }
    uVar1 = *pdVar8;
    local_51c = iVar9;
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,framebuffers);
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers_00);
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers_00);
    sglr::ContextWrapper::glRenderbufferStorage
              (this_00,0x8d41,0x8058,
               *(int *)((long)&(this->super_FboTestCase).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar6),
               *(int *)((long)&(this->super_FboTestCase).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar6 + 4));
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorage
              (this_00,0x8d41,this->m_format,
               *(int *)((long)&(this->super_FboTestCase).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar6),
               *(int *)((long)&(this->super_FboTestCase).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar6 + 4));
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers_00);
    if ((uVar1 >> 8 & 1) != 0) {
      sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,*renderbuffers);
    }
    if ((uVar1 >> 10 & 1) != 0) {
      sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,*renderbuffers);
    }
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
    sglr::ContextWrapper::glClearBufferfi(this_00,0x84f9,0,1.0,0);
    iVar9 = local_51c + -1;
  } while (iVar9 == 0);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,srcFbo);
  dVar5 = local_520;
  dVar4 = local_524;
  dVar3 = local_528;
  sglr::ContextWrapper::glViewport
            (this_00,0,0,(this->m_srcSize).m_data[0],(this->m_srcSize).m_data[1]);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,7,0xff);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  data.m_format.order = 0xbf800000;
  data.m_format.type = 0xbf800000;
  data.m_size.m_data[0] = -0x40800000;
  local_4d8.super_ConstPixelBufferAccess.m_format = (TextureFormat)&DAT_3f8000003f800000;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
  sglr::drawQuad(pCVar7,dVar3,(Vec3 *)&data,(Vec3 *)&local_4d8);
  iVar9 = (this->m_srcSize).m_data[0];
  iVar2 = (this->m_srcSize).m_data[1];
  gridTex = 0;
  local_4d8.super_ConstPixelBufferAccess.m_format = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&data,(TextureFormat *)&local_4d8,iVar9,iVar2,1);
  tcu::TextureLevel::getAccess(&local_4d8,&data);
  local_498.m_data[0] = 0.2;
  local_498.m_data[1] = 0.7;
  local_498.m_data[2] = 0.1;
  local_498.m_data[3] = 1.0;
  local_488.m_data[0] = 0.7;
  local_488.m_data[1] = 0.1;
  local_488.m_data[2] = 0.5;
  local_488.m_data[3] = 0.8;
  tcu::fillWithGrid(&local_4d8,8,&local_498,&local_488);
  sglr::ContextWrapper::glGenTextures(this_00,1,&gridTex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,gridTex);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  tcu::TextureLevel::getAccess(&local_4d8,&data);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,0x1908,iVar9,iVar2,0,0x1908,0x1401,
             local_4d8.super_ConstPixelBufferAccess.m_data);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,dstFbo);
  sglr::ContextWrapper::glViewport
            (this_00,0,0,(this->m_dstSize).m_data[0],(this->m_dstSize).m_data[1]);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4d8.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
  local_4d8.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_498.m_data._0_8_ = &DAT_3f8000003f800000;
  local_498.m_data._8_8_ = local_498.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(pCVar7,dVar4,(Vec3 *)&local_4d8,(Vec3 *)&local_498);
  tcu::TextureLevel::~TextureLevel(&data);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,srcFbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,dstFbo);
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,(this->m_srcRect).m_data[0],(this->m_srcRect).m_data[1],
             (this->m_srcRect).m_data[2],(this->m_srcRect).m_data[3],(this->m_dstRect).m_data[0],
             (this->m_dstRect).m_data[1],(this->m_dstRect).m_data[2],(this->m_dstRect).m_data[3],
             this->m_copyBuffers,0x2600);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,dstFbo);
  sglr::ContextWrapper::glViewport
            (this_00,0,0,(this->m_dstSize).m_data[0],(this->m_dstSize).m_data[1]);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e03,0x1e00);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,0,0xff);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  data.m_format.order = R;
  data.m_format.type = SNORM_INT8;
  data.m_size.m_data._0_8_ = &DAT_3f8000003f800000;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,dVar5,(Vec4 *)&data);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  data.m_format.order = 0xbf800000;
  data.m_format.type = 0xbf800000;
  data.m_size.m_data._0_8_ = data.m_size.m_data._0_8_ & 0xffffffff00000000;
  local_4d8.super_ConstPixelBufferAccess.m_format = (TextureFormat)&DAT_3f8000003f800000;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  sglr::drawQuad(pCVar7,dVar5,(Vec3 *)&data,(Vec3 *)&local_4d8);
  if ((this->m_dstBuffers & 0x400) != 0) {
    sglr::ContextWrapper::glDisable(this_00,0xb71);
    sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e00);
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,6,0xff);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    data.m_format.order = R;
    data.m_format.type = 0x3f800000;
    data.m_size.m_data[0] = 0;
    data.m_size.m_data[1] = 0x3f800000;
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,dVar5,(Vec4 *)&data);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    data.m_format.order = 0xbf800000;
    data.m_format.type = 0xbf800000;
    data.m_size.m_data._0_8_ = data.m_size.m_data._0_8_ & 0xffffffff00000000;
    local_4d8.super_ConstPixelBufferAccess.m_format = (TextureFormat)&DAT_3f8000003f800000;
    local_4d8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    sglr::drawQuad(pCVar7,dVar5,(Vec3 *)&data,(Vec3 *)&local_4d8);
  }
  iVar9 = (this->m_dstSize).m_data[0];
  iVar2 = (this->m_dstSize).m_data[1];
  local_498.m_data._0_8_ = glu::mapGLInternalFormat(0x8058);
  lVar6 = 0;
  do {
    data.m_size.m_data[lVar6 + -2] = 0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_4d8.super_ConstPixelBufferAccess.m_format.order = R;
  local_4d8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_4d8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  FboTestCase::readPixels
            (&this->super_FboTestCase,local_4b0,0,0,iVar9,iVar2,(TextureFormat *)&local_498,
             (Vec4 *)&data,(Vec4 *)&local_4d8);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32			colorFormat			= GL_RGBA8;

		GradientShader			gradShader			(glu::TYPE_FLOAT_VEC4);
		Texture2DShader			texShader			(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		FlatColorShader			flatShader			(glu::TYPE_FLOAT_VEC4);

		deUint32				flatShaderID		= getCurrentContext()->createProgram(&flatShader);
		deUint32				texShaderID			= getCurrentContext()->createProgram(&texShader);
		deUint32				gradShaderID		= getCurrentContext()->createProgram(&gradShader);

		deUint32				srcFbo				= 0;
		deUint32				dstFbo				= 0;
		deUint32				srcColorRbo			= 0;
		deUint32				dstColorRbo			= 0;
		deUint32				srcDepthStencilRbo	= 0;
		deUint32				dstDepthStencilRbo	= 0;

		// setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		texShader.setUniforms(*getCurrentContext(), texShaderID);

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&		fbo				= ndx ? dstFbo : srcFbo;
			deUint32&		colorRbo		= ndx ? dstColorRbo : srcColorRbo;
			deUint32&		depthStencilRbo	= ndx ? dstDepthStencilRbo : srcDepthStencilRbo;
			deUint32		bufs			= ndx ? m_dstBuffers : m_srcBuffers;
			const IVec2&	size			= ndx ? m_dstSize : m_srcSize;

			glGenFramebuffers(1, &fbo);
			glGenRenderbuffers(1, &colorRbo);
			glGenRenderbuffers(1, &depthStencilRbo);

			glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
			glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, size.x(), size.y());

			glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorage(GL_RENDERBUFFER, m_format, size.x(), size.y());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

			if (bufs & GL_DEPTH_BUFFER_BIT)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
			if (bufs & GL_STENCIL_BUFFER_BIT)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);

			// Clear depth to 1 and stencil to 0.
			glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);
		}

		// Fill source with gradient, depth = [-1..1], stencil = 7
		glBindFramebuffer(GL_FRAMEBUFFER, srcFbo);
		glViewport(0, 0, m_srcSize.x(), m_srcSize.y());
		glEnable(GL_DEPTH_TEST);
		glEnable(GL_STENCIL_TEST);
		glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc(GL_ALWAYS, 7, 0xffu);

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Fill destination with grid pattern, depth = 0 and stencil = 1
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= m_srcSize.x();
			const int			texH		= m_srcSize.y();
			deUint32			gridTex		= 0;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &gridTex);
			glBindTexture(GL_TEXTURE_2D, gridTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, dstFbo);
			glViewport(0, 0, m_dstSize.x(), m_dstSize.y());
			glStencilFunc(GL_ALWAYS, 1, 0xffu);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Perform copy.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, srcFbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, dstFbo);
		glBlitFramebuffer(m_srcRect.x(), m_srcRect.y(), m_srcRect.z(), m_srcRect.w(), m_dstRect.x(), m_dstRect.y(), m_dstRect.z(), m_dstRect.w(), m_copyBuffers, GL_NEAREST);

		// Render blue color where depth < 0, decrement on depth failure.
		glBindFramebuffer(GL_FRAMEBUFFER, dstFbo);
		glViewport(0, 0, m_dstSize.x(), m_dstSize.y());
		glStencilOp(GL_KEEP, GL_DECR, GL_KEEP);
		glStencilFunc(GL_ALWAYS, 0, 0xffu);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		if (m_dstBuffers & GL_STENCIL_BUFFER_BIT)
		{
			// Render green color where stencil == 6.
			glDisable(GL_DEPTH_TEST);
			glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
			glStencilFunc(GL_EQUAL, 6, 0xffu);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, m_dstSize.x(), m_dstSize.y(), glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}